

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void * hashmap_get(hashmap_t *map,char *data,size_t length)

{
  _Bool _Var1;
  size_t sVar2;
  hashmap_entry_t *local_40;
  hashmap_entry_t *entry;
  size_t index;
  size_t hash;
  size_t length_local;
  char *data_local;
  hashmap_t *map_local;
  
  sVar2 = hashmap_hash(data,length);
  local_40 = map->buckets[sVar2 & map->capacity - 1];
  while( true ) {
    if (local_40 == (hashmap_entry_t *)0x0) {
      return (void *)0x0;
    }
    if ((local_40->hash == sVar2) && (_Var1 = hashmap_eq(local_40,data,length), _Var1)) break;
    local_40 = local_40->next;
  }
  return local_40->value;
}

Assistant:

static void* hashmap_get(const hashmap_t* map, const char* data, size_t length)
{
    size_t hash = hashmap_hash(data, length);
    size_t index = hash & (map->capacity - 1);

    hashmap_entry_t* entry = map->buckets[index];
    while(entry) {
        if(entry->hash == hash && hashmap_eq(entry, data, length))
            return entry->value;
        entry = entry->next;
    }

    return NULL;
}